

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O3

int arkode_butcher_order5d
              (sunrealtype *b,sunrealtype *c1,sunrealtype **A,sunrealtype *c2,sunrealtype *c3,int s)

{
  int iVar1;
  sunrealtype *x;
  sunrealtype *b_00;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  x = (sunrealtype *)calloc((long)s,8);
  b_00 = (sunrealtype *)calloc((long)s,8);
  if ((((s < 1) || (c2 == (sunrealtype *)0x0)) || (c3 == (sunrealtype *)0x0)) ||
     (x == (sunrealtype *)0x0)) {
    free(x);
  }
  else {
    uVar3 = (ulong)(uint)s;
    uVar2 = 0;
    do {
      x[uVar2] = c2[uVar2] * c3[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    iVar1 = arkode_butcher_mv(A,x,s,b_00);
    if ((iVar1 == 0) && (c1 != (sunrealtype *)0x0 && b != (sunrealtype *)0x0)) {
      uVar2 = 0;
      do {
        x[uVar2] = b[uVar2] * c1[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
      if (b_00 == (sunrealtype *)0x0) {
        return 0;
      }
      dVar4 = 0.0;
      uVar2 = 0;
      do {
        dVar4 = dVar4 + x[uVar2] * b_00[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
      free(x);
      free(b_00);
      return (uint)(ABS(dVar4 + -0.06666666666666667) <= 1.4901161193847656e-08);
    }
    free(x);
  }
  free(b_00);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order5d(sunrealtype* b, sunrealtype* c1,
                                             sunrealtype** A, sunrealtype* c2,
                                             sunrealtype* c3, int s)
{
  sunrealtype bcAcc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c2, c3, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(b, c1, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(tmp1, tmp2, s, &bcAcc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bcAcc - SUN_RCONST(1.0) / SUN_RCONST(15.0)) > TOL) ? SUNFALSE
                                                                     : SUNTRUE;
}